

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexTestTest.cpp
# Opt level: O1

void __thiscall RegexTestTest::RegexTestTest(RegexTestTest *this)

{
  TestText *pTVar1;
  pointer *__ptr;
  undefined1 local_c8 [8];
  _Head_base<0UL,_TestText_*,_false> local_c0;
  undefined1 local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<const_oout::Test> local_a8;
  StringText *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  shared_ptr<oout::EqualTest> local_88;
  shared_ptr<oout::NamedTest> local_78;
  StringText *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<oout::EqualTest> local_58;
  shared_ptr<oout::NamedTest> local_48;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"RegexTest test","");
  local_68 = (StringText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,char_const(&)[5]>
            (&local_60,&local_68,(allocator<oout::StringText> *)&local_a8,(char (*) [5])0x17d264);
  std::make_unique<oout::RegexTest,std::shared_ptr<oout::StringText>,char_const(&)[5]>
            ((shared_ptr<oout::StringText> *)local_b8,(char (*) [5])&local_68);
  pTVar1 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::RegexTest,std::default_delete<oout::RegexTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)local_b8);
  TestText::TestText(pTVar1,&local_a8);
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1;
  if (local_a8.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_58,(allocator<oout::EqualTest> *)&local_a8,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_b0,
             (char (*) [8])0x17da77);
  local_48.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[29],std::shared_ptr<oout::EqualTest>>
            (&local_48.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_48,(allocator<oout::NamedTest> *)&local_a8,
             (char (*) [29])"RegexTest success if matched",&local_58);
  local_98 = (StringText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,char_const(&)[5]>
            (&local_90,&local_98,(allocator<oout::StringText> *)&local_a8,(char (*) [5])0x17d264);
  std::make_unique<oout::RegexTest,std::shared_ptr<oout::StringText>,char_const(&)[4]>
            ((shared_ptr<oout::StringText> *)local_c8,(char (*) [4])&local_98);
  pTVar1 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::RegexTest,std::default_delete<oout::RegexTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)local_c8);
  TestText::TestText(pTVar1,&local_a8);
  local_c0._M_head_impl = pTVar1;
  if (local_a8.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_88.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_88.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_88,(allocator<oout::EqualTest> *)&local_a8,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_c0,
             (char (*) [8])0x17dda4);
  local_78.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            (&local_78.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_78,(allocator<oout::NamedTest> *)&local_a8,
             (char (*) [31])"RegexTest failure if not match",&local_88);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_38,&local_48,&local_78);
  if (local_78.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0._M_head_impl != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_c0,local_c0._M_head_impl);
  }
  local_c0._M_head_impl = (TestText *)0x0;
  if ((_Head_base<0UL,_oout::RegexTest_*,_false>)local_c8 !=
      (_Head_base<0UL,_oout::RegexTest_*,_false>)0x0) {
    std::default_delete<oout::RegexTest>::operator()
              ((default_delete<oout::RegexTest> *)local_c8,(RegexTest *)local_c8);
  }
  local_c8 = (undefined1  [8])0x0;
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  if (local_48.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((TestText *)local_b0._M_pi != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_b0,(TestText *)local_b0._M_pi);
  }
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Head_base<0UL,_oout::RegexTest_*,_false>)local_b8 !=
      (_Head_base<0UL,_oout::RegexTest_*,_false>)0x0) {
    std::default_delete<oout::RegexTest>::operator()
              ((default_delete<oout::RegexTest> *)local_b8,(RegexTest *)local_b8);
  }
  local_b8 = (undefined1  [8])0x0;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001988b0;
  return;
}

Assistant:

RegexTestTest::RegexTestTest()
: dirty::Test(
	"RegexTest test",
	make_shared<NamedTest>(
		"RegexTest success if matched",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<RegexTest>(
					make_shared<StringText>("test"),
					"t.+t"
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"RegexTest failure if not match",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<RegexTest>(
					make_shared<StringText>("test"),
					R"(\d+)"
				)
			),
			"failure"
		)
	)
)
{
}